

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O2

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> __thiscall
anon_unknown.dwarf_988a7::BuildManifestActions::readFile
          (BuildManifestActions *this,StringRef path,StringRef forFilename,Token *forToken)

{
  Parser *parser;
  storage_type *psVar1;
  Error *E;
  char *pcVar2;
  StringRef filename;
  StringRef filename_00;
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  bufferOrError;
  string error;
  Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> EStack_68
  ;
  StringRef local_58;
  ulong local_38;
  
  pcVar2 = path.Data;
  filename.Length = path.Length;
  filename.Data = (char *)&EStack_68;
  llbuild::commands::util::readFileContents(filename);
  if ((EStack_68._8_1_ & 1) == 0) {
    psVar1 = llvm::
             Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::getStorage(&EStack_68);
    (this->super_ManifestLoaderActions)._vptr_ManifestLoaderActions =
         (_func_int **)
         (psVar1->_M_t).
         super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
         super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
         super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    (psVar1->_M_t).
    super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
    super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
    super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = (MemoryBuffer *)0x0;
  }
  else {
    llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    takeError((Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
               *)&local_38);
    llvm::toString_abi_cxx11_((string *)&local_58,(llvm *)&local_38,E);
    if ((long *)(local_38 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_38 & 0xfffffffffffffffe) + 8))();
    }
    *(int *)(pcVar2 + 0x18) = *(int *)(pcVar2 + 0x18) + 1;
    if (bufferOrError._8_8_ == 0) {
      BuildContext::emitError(*(BuildContext **)(pcVar2 + 8),(string *)&local_58);
    }
    else {
      parser = llbuild::ninja::ManifestLoader::getCurrentParser(*(ManifestLoader **)(pcVar2 + 0x10))
      ;
      filename_00.Length = (size_t)forToken;
      filename_00.Data = (char *)forFilename.Length;
      llbuild::commands::util::emitError(filename_00,local_58,(Token *)bufferOrError._8_8_,parser);
    }
    (this->super_ManifestLoaderActions)._vptr_ManifestLoaderActions = (_func_int **)0x0;
    std::__cxx11::string::_M_dispose();
  }
  llvm::Expected<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
  ~Expected(&EStack_68);
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         this;
}

Assistant:

virtual std::unique_ptr<llvm::MemoryBuffer> readFile(
      StringRef path, StringRef forFilename,
      const ninja::Token* forToken) override {
    auto bufferOrError = util::readFileContents(path);
    if (bufferOrError)
      return std::move(*bufferOrError);

    // TODO: util::emitError doesn't use the console queue?
    std::string error = llvm::toString(bufferOrError.takeError());
    ++numErrors;
    if (forToken) {
      util::emitError(forFilename, error, *forToken,
                      loader->getCurrentParser());
    } else {
      context.emitError(std::move(error));
    }
    return nullptr;
  }